

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O0

bool __thiscall
xray_re::xr_ini_file::r_line(xr_ini_file *this,char *sname,size_t lindex,char **lname,char **lvalue)

{
  ini_section *this_00;
  size_t sVar1;
  char *pcVar2;
  ini_item *item;
  ini_section *section;
  char **lvalue_local;
  char **lname_local;
  size_t lindex_local;
  char *sname_local;
  xr_ini_file *this_local;
  
  this_00 = r_section(this,sname);
  sVar1 = ini_section::size(this_00);
  if (lindex < sVar1) {
    std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
    ::operator[](&this_00->items,lindex);
    if (lname != (char **)0x0) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      *lname = pcVar2;
    }
    if (lvalue != (char **)0x0) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      *lvalue = pcVar2;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool xr_ini_file::r_line(const char* sname, size_t lindex, const char** lname, const char** lvalue) const
{
	const ini_section* section = r_section(sname);
	if (lindex >= section->size())
		return false;
	const ini_item* item = section->items[lindex];
	if (lname)
		*lname = item->name.c_str();
	if (lvalue)
		*lvalue = item->value.c_str();
	return true;
}